

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O0

void __thiscall QtMWidgets::NavigationArrow::animate(NavigationArrow *this)

{
  ulong uVar1;
  NavigationArrowPrivate *pNVar2;
  QColor QVar3;
  undefined8 local_30;
  undefined4 local_28;
  ushort uStack_24;
  NavigationArrow *this_local;
  
  QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
  ::operator->(&this->d);
  uVar1 = QTimer::isActive();
  if ((uVar1 & 1) != 0) {
    QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
    ::operator->(&this->d);
    QTimer::stop();
  }
  pNVar2 = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
           ::operator->(&this->d);
  QVar3 = lighterColor(&pNVar2->baseColor,0x19);
  local_30 = QVar3._0_8_;
  local_28 = QVar3.ct._4_4_;
  uStack_24 = QVar3.ct._8_2_;
  pNVar2 = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
           ::operator->(&this->d);
  *(undefined8 *)&pNVar2->color = local_30;
  *(undefined4 *)((long)&(pNVar2->color).ct + 4) = local_28;
  (pNVar2->color).ct.argb.pad = uStack_24;
  pNVar2 = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
           ::operator->(&this->d);
  QTimer::start((int)pNVar2->timer);
  QWidget::update();
  return;
}

Assistant:

void
NavigationArrow::animate()
{
	if( d->timer->isActive() )
		d->timer->stop();

	d->color = lighterColor( d->baseColor, 25 );

	d->timer->start( 500 );

	update();
}